

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<phmap::priv::hash_internal::Enum,std::__cxx11::string>::
     construct<phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::Enum_const&>,std::tuple<>>
               (Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,
               tuple<const_phmap::priv::hash_internal::Enum_&> *args_1,tuple<> *args_2)

{
  tuple<> *args_local_2;
  tuple<const_phmap::priv::hash_internal::Enum_&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *alloc_local;
  
  map_slot_policy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::emplace(slot);
  allocator_traits<phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::
  construct<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::Enum_const&>,std::tuple<>>
            (alloc,(pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
        emplace(slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                         std::forward<Args>(args)...);
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                         std::forward<Args>(args)...);
        }
    }